

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.cpp
# Opt level: O1

istream * baryonyx::operator>>(istream *is,result *ret)

{
  pointer *ppsVar1;
  pointer *ppbVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  iterator __position;
  long lVar3;
  iterator __position_00;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  char cVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  void *pvVar9;
  runtime_error *prVar10;
  string_buffer *__tmp;
  size_type __size;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  string_view str;
  string buffer;
  char buffer_1 [513];
  int local_270;
  uint local_26c;
  char *local_268;
  size_t local_260;
  char local_258;
  undefined7 uStack_257;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_248;
  result *local_240;
  string_view local_238 [32];
  
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0072ea80;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  (ret->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  this = (ret->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (ret->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var8;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ret->status = success;
  __position._M_current =
       (ret->solutions).super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ret->solutions).super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::_M_realloc_insert<>
              (&ret->solutions,__position);
  }
  else {
    ((__position._M_current)->variables).
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ((__position._M_current)->variables).
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ((__position._M_current)->variables).
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__position._M_current)->value = 0.0;
    ppsVar1 = &(ret->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppsVar1 = *ppsVar1 + 1;
  }
  local_268 = &local_258;
  local_260 = 0;
  local_258 = '\0';
  lVar3 = *(long *)(*(long *)is + -0x18);
  if (*(int *)(is + lVar3 + 0x20) == 0) {
    local_248 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                 *)&ret->variable_name;
    local_270 = 0;
    local_240 = ret;
    do {
      cVar6 = std::ios::widen((char)lVar3 + (char)is);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&local_268,cVar6);
      __n = local_260;
      pcVar4 = local_268;
      if (local_260 == 0) {
        uVar13 = 0xffffffffffffffff;
        if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) != 0) break;
      }
      else {
        sVar11 = 0;
        do {
          cVar6 = pcVar4[sVar11];
          iVar7 = isspace((int)cVar6);
          pcVar5 = local_268;
          if (iVar7 == 0) {
            if (cVar6 == '\\') goto LAB_001ca7c9;
            break;
          }
          sVar11 = sVar11 + 1;
        } while (__n != sVar11);
        pvVar9 = memchr(local_268,0x3d,__n);
        uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar5;
      }
      pcVar4 = local_268;
      if (uVar13 == 0xffffffffffffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x40);
        std::runtime_error::runtime_error(prVar10,"file_format_failure");
        *(undefined ***)prVar10 = &PTR__file_format_failure_0072ee48;
        *(runtime_error **)(prVar10 + 0x10) = prVar10 + 0x20;
        *(undefined8 *)(prVar10 + 0x18) = 0;
        prVar10[0x20] = (runtime_error)0x0;
        *(int *)(prVar10 + 0x30) = local_270;
        *(undefined8 *)(prVar10 + 0x34) = 0xd00000000;
        __cxa_throw(prVar10,&file_format_failure::typeinfo,file_format_failure::~file_format_failure
                   );
      }
      if (__n - uVar13 < 0x201) {
        memset(local_238,0,0x201);
        if (__n != uVar13) {
          memcpy(local_238,pcVar4 + uVar13 + 1,__n - uVar13);
        }
        local_26c = 0;
        iVar7 = __isoc99_sscanf(local_238,"%d",&local_26c);
        uVar12 = 0x100000000;
        if (iVar7 == 0) {
          uVar12 = 0;
        }
        uVar12 = uVar12 | local_26c;
        ret = local_240;
      }
      else {
        uVar12 = 0;
      }
      if ((uVar12 & 0x100000000) == 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x40);
        std::runtime_error::runtime_error(prVar10,"file_format_failure");
        *(undefined ***)prVar10 = &PTR__file_format_failure_0072ee48;
        *(runtime_error **)(prVar10 + 0x10) = prVar10 + 0x20;
        *(undefined8 *)(prVar10 + 0x18) = 0;
        prVar10[0x20] = (runtime_error)0x0;
        *(int *)(prVar10 + 0x30) = local_270;
        *(undefined8 *)(prVar10 + 0x34) = 0xd00000000;
        __cxa_throw(prVar10,&file_format_failure::typeinfo,file_format_failure::~file_format_failure
                   );
      }
      str._M_str = pcVar4;
      str._M_len = uVar13;
      local_238[0] = string_buffer::append
                               ((ret->strings).
                                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,str);
      __position_00._M_current =
           (ret->variable_name).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (ret->variable_name).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  (local_248,__position_00,local_238);
      }
      else {
        (__position_00._M_current)->_M_len = local_238[0]._M_len;
        (__position_00._M_current)->_M_str = local_238[0]._M_str;
        ppbVar2 = &(ret->variable_name).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar2 = *ppbVar2 + 1;
      }
      local_238[0]._M_len._0_1_ = (int)uVar12 != 0;
      std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<bool>
                (&(ret->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].variables,(bool *)local_238);
      local_270 = local_270 + 1;
LAB_001ca7c9:
      lVar3 = *(long *)(*(long *)is + -0x18);
    } while (*(int *)(is + lVar3 + 0x20) == 0);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  return is;
}

Assistant:

std::istream&
operator>>(std::istream& is, result& ret)
{
    ret.strings = std::make_shared<baryonyx::string_buffer>();

    ret.status = result_status::success;
    ret.solutions.emplace_back();
    int line{ 0 };

    std::string buffer;
    while (is.good()) {
        std::getline(is, buffer);

        if (buffer.empty() && is.eof())
            return is;

        std::string::size_type i{ 0 };
        std::string::size_type e{ buffer.size() };

        for (; i != e; ++i)
            if (!std::isspace(buffer[i]))
                break;

        if (i != e && buffer[i] == '\\')
            continue;

        auto found = buffer.find('=', 0);
        if (found == std::string::npos)
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);

        std::string_view left(buffer.data(), found);
        std::string_view right(buffer.data() + found + 1,
                               buffer.size() - found);

        if (auto value = to_int(right); value.has_value()) {
            ret.variable_name.emplace_back(ret.strings->append(left));
            ret.solutions.back().variables.emplace_back(!!(*value));
        } else {
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);
        }
        ++line;
    }

    return is;
}